

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::EnhancedLayouts::SSBMemberOffsetAndAlignTest::isDrawRelevant
          (SSBMemberOffsetAndAlignTest *this,GLuint param_1)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  bool local_31;
  int local_30;
  int local_2c;
  GLint vs_supported_buffers;
  GLint tes_supported_buffers;
  GLint tcs_supported_buffers;
  GLint gs_supported_buffers;
  Functions *gl;
  SSBMemberOffsetAndAlignTest *pSStack_10;
  GLuint param_1_local;
  SSBMemberOffsetAndAlignTest *this_local;
  
  gl._4_4_ = param_1;
  pSStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _tcs_supported_buffers = CONCAT44(extraout_var,iVar1);
  tes_supported_buffers = 0;
  vs_supported_buffers = 0;
  local_2c = 0;
  local_30 = 0;
  (**(code **)(_tcs_supported_buffers + 0x868))(0x90d7,&tes_supported_buffers);
  (**(code **)(_tcs_supported_buffers + 0x868))(0x90d8,&vs_supported_buffers);
  (**(code **)(_tcs_supported_buffers + 0x868))(0x90d9,&local_2c);
  (**(code **)(_tcs_supported_buffers + 0x868))(0x90d6,&local_30);
  err = (**(code **)(_tcs_supported_buffers + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2972);
  local_31 = false;
  if (((0 < tes_supported_buffers) && (local_31 = false, 0 < vs_supported_buffers)) &&
     (local_31 = false, 0 < local_2c)) {
    local_31 = 0 < local_30;
  }
  return local_31;
}

Assistant:

bool SSBMemberOffsetAndAlignTest::isDrawRelevant(GLuint /* test_case_index */)
{
	const Functions& gl					   = m_context.getRenderContext().getFunctions();
	GLint			 gs_supported_buffers  = 0;
	GLint			 tcs_supported_buffers = 0;
	GLint			 tes_supported_buffers = 0;
	GLint			 vs_supported_buffers  = 0;

	gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &gs_supported_buffers);
	gl.getIntegerv(GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, &tcs_supported_buffers);
	gl.getIntegerv(GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, &tes_supported_buffers);
	gl.getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &vs_supported_buffers);

	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	return ((1 <= gs_supported_buffers) && (1 <= tcs_supported_buffers) && (1 <= tes_supported_buffers) &&
			(1 <= vs_supported_buffers));
}